

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O1

void * __thiscall
DeviceTy::getOrAllocTgtPtr
          (DeviceTy *this,void *HstPtrBegin,void *HstPtrBase,int64_t Size,bool *IsNew,
          bool IsImplicit,bool UpdateRefCount)

{
  size_t *psVar1;
  int iVar2;
  _List_node_base *p_Var3;
  iterator iVar4;
  _List_node_base *p_Var5;
  LookupResult LVar6;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->DataMapMtx);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  LVar6 = lookupMapping(this,HstPtrBegin,Size);
  iVar4 = LVar6.Entry._M_node;
  if ((((undefined1  [16])LVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
     (IsImplicit && ((undefined1  [16])LVar6 & (undefined1  [16])0x6) != (undefined1  [16])0x0)) {
    *IsNew = false;
    if (UpdateRefCount) {
      iVar4._M_node[3]._M_next = (_List_node_base *)((long)&(iVar4._M_node[3]._M_next)->_M_next + 1)
      ;
    }
    p_Var5 = (_List_node_base *)
             (((long)HstPtrBegin + (long)iVar4._M_node[2]._M_prev) - (long)iVar4._M_node[1]._M_prev)
    ;
    goto LAB_001030a8;
  }
  if (((undefined1  [16])LVar6 & (undefined1  [16])0x6) == (undefined1  [16])0x0) {
    if (Size != 0) goto LAB_001030db;
  }
  else if (Size != 0 && IsImplicit) {
LAB_001030db:
    *IsNew = true;
    p_Var5 = (_List_node_base *)(*this->RTL->data_alloc)(this->RTLDeviceID,Size,HstPtrBegin);
    p_Var3 = (_List_node_base *)operator_new(0x38);
    p_Var3[1]._M_next = (_List_node_base *)HstPtrBase;
    p_Var3[1]._M_prev = (_List_node_base *)HstPtrBegin;
    p_Var3[2]._M_next = (_List_node_base *)(Size + (long)HstPtrBegin);
    p_Var3[2]._M_prev = p_Var5;
    p_Var3[3]._M_next = (_List_node_base *)0x1;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->HostDataToTargetMap).
              super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    goto LAB_001030a8;
  }
  p_Var5 = (_List_node_base *)0x0;
LAB_001030a8:
  pthread_mutex_unlock((pthread_mutex_t *)&this->DataMapMtx);
  return p_Var5;
}

Assistant:

void *DeviceTy::getOrAllocTgtPtr(void *HstPtrBegin, void *HstPtrBase,
    int64_t Size, bool &IsNew, bool IsImplicit, bool UpdateRefCount) {
  void *rc = NULL;
  DataMapMtx.lock();
  LookupResult lr = lookupMapping(HstPtrBegin, Size);

  // Check if the pointer is contained.
  if (lr.Flags.IsContained ||
      ((lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) && IsImplicit)) {
    auto &HT = *lr.Entry;
    IsNew = false;

    if (UpdateRefCount)
      ++HT.RefCount;

    uintptr_t tp = HT.TgtPtrBegin + ((uintptr_t)HstPtrBegin - HT.HstPtrBegin);
    DP("Mapping exists%s with HstPtrBegin=" DPxMOD ", TgtPtrBegin=" DPxMOD ", "
        "Size=%ld,%s RefCount=%s\n", (IsImplicit ? " (implicit)" : ""),
        DPxPTR(HstPtrBegin), DPxPTR(tp), Size,
        (UpdateRefCount ? " updated" : ""),
        (CONSIDERED_INF(HT.RefCount)) ? "INF" :
            std::to_string(HT.RefCount).c_str());
    rc = (void *)tp;
  } else if ((lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) && !IsImplicit) {
    // Explicit extension of mapped data - not allowed.
    DP("Explicit extension of mapping is not allowed.\n");
  } else if (Size) {
    // If it is not contained and Size > 0 we should create a new entry for it.
    IsNew = true;
    uintptr_t tp = (uintptr_t)RTL->data_alloc(RTLDeviceID, Size, HstPtrBegin);
    DP("Creating new map entry: HstBase=" DPxMOD ", HstBegin=" DPxMOD ", "
        "HstEnd=" DPxMOD ", TgtBegin=" DPxMOD "\n", DPxPTR(HstPtrBase),
        DPxPTR(HstPtrBegin), DPxPTR((uintptr_t)HstPtrBegin + Size), DPxPTR(tp));
    HostDataToTargetMap.push_front(HostDataToTargetTy((uintptr_t)HstPtrBase,
        (uintptr_t)HstPtrBegin, (uintptr_t)HstPtrBegin + Size, tp));
    rc = (void *)tp;
  }

  DataMapMtx.unlock();
  return rc;
}